

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_sets.h
# Opt level: O0

TargetBits
highwayhash::InstructionSets::
RunAll<highwayhash::HighwayHashTest,_const_unsigned_long_(&)[4],_char_(&)[65],_unsigned_long_&,_const_unsigned_long_(*&)[4],_void_(*)(const_char_*,_unsigned_long)>
          (unsigned_long (*args) [4],char (*args_1) [65],unsigned_long *args_2,
          unsigned_long (**args_3) [4],_func_void_char_ptr_unsigned_long **args_4)

{
  HHNotify in_stack_00000040;
  HHResult256 *in_stack_00000048;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  HHKey *in_stack_00000060;
  HighwayHashTest<4U> *in_stack_00000068;
  HighwayHashTest<1U> local_37;
  HighwayHashTest<2U> local_36 [2];
  TargetBits local_34;
  _func_void_char_ptr_unsigned_long **pp_Stack_30;
  TargetBits supported;
  _func_void_char_ptr_unsigned_long **args_local_4;
  unsigned_long (**args_local_3) [4];
  unsigned_long *args_local_2;
  char (*args_local_1) [65];
  unsigned_long (*args_local) [4];
  
  pp_Stack_30 = args_4;
  args_local_4 = (_func_void_char_ptr_unsigned_long **)args_3;
  args_local_3 = (unsigned_long (**) [4])args_2;
  args_local_2 = (unsigned_long *)args_1;
  args_local_1 = (char (*) [65])args;
  local_34 = Supported();
  if ((local_34 & 4) != 0) {
    HighwayHashTest<4U>::operator()
              (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
               in_stack_00000048,in_stack_00000040);
  }
  if ((local_34 & 2) != 0) {
    HighwayHashTest<2U>::operator()
              (local_36,(HHKey *)args_local_1,(char *)args_local_2,(size_t)*args_local_3,
               (HHResult256 *)*args_local_4,(HHNotify)*pp_Stack_30);
  }
  HighwayHashTest<1U>::operator()
            (&local_37,(HHKey *)args_local_1,(char *)args_local_2,(size_t)*args_local_3,
             (HHResult256 *)*args_local_4,(HHNotify)*pp_Stack_30);
  return local_34;
}

Assistant:

static HH_INLINE TargetBits RunAll(Args&&... args) {
    const TargetBits supported = Supported();

#if HH_ARCH_X64
    if (supported & HH_TARGET_AVX2) {
      Func<HH_TARGET_AVX2>()(std::forward<Args>(args)...);
    }
    if (supported & HH_TARGET_SSE41) {
      Func<HH_TARGET_SSE41>()(std::forward<Args>(args)...);
    }
#elif HH_ARCH_PPC
    if (supported & HH_TARGET_VSX) {
      Func<HH_TARGET_VSX>()(std::forward<Args>(args)...);
    }

#elif HH_ARCH_NEON
    if (supported & HH_TARGET_NEON) {
      Func<HH_TARGET_NEON>()(std::forward<Args>(args)...);
    }
#endif

    Func<HH_TARGET_Portable>()(std::forward<Args>(args)...);

    return supported;  // i.e. all that were run
  }